

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int send_finished(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  size_t *psVar1;
  ptls_buffer_t *buf;
  ptls_key_schedule_t *sched;
  size_t sVar2;
  int iVar3;
  undefined8 in_RAX;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar3 = (*emitter->begin_message)(emitter);
  if (iVar3 == 0) {
    buf = emitter->buf;
    sched = tls->key_schedule;
    sVar2 = buf->off;
    uStack_38 = CONCAT17(0x14,(undefined7)uStack_38);
    iVar3 = ptls_buffer__do_pushv(buf,(void *)((long)&uStack_38 + 7),1);
    if (iVar3 == 0) {
      iVar3 = ptls_buffer__do_pushv(buf,"",3);
      if (iVar3 == 0) {
        sVar6 = buf->off;
        iVar3 = ptls_buffer_reserve(emitter->buf,(tls->key_schedule->hashes[0].algo)->digest_size);
        if (iVar3 == 0) {
          iVar3 = calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,
                                   &(tls->traffic_protection).enc);
          if (iVar3 == 0) {
            psVar1 = &emitter->buf->off;
            *psVar1 = *psVar1 + (tls->key_schedule->hashes[0].algo)->digest_size;
            uVar4 = buf->off - sVar6;
            for (lVar5 = 0x10; lVar5 != -8; lVar5 = lVar5 + -8) {
              buf->base[sVar6 - 3] = (uint8_t)(uVar4 >> ((byte)lVar5 & 0x3f));
              sVar6 = sVar6 + 1;
            }
            if (sched != (ptls_key_schedule_t *)0x0) {
              ptls__key_schedule_update_hash(sched,buf->base + sVar2,buf->off - sVar2);
            }
            iVar3 = (*emitter->commit_message)(emitter);
            return iVar3;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
        if ((ret = ptls_buffer_reserve(emitter->buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = calc_verify_data(emitter->buf->base + emitter->buf->off, tls->key_schedule,
                                    tls->traffic_protection.enc.secret)) != 0)
            goto Exit;
        emitter->buf->off += tls->key_schedule->hashes[0].algo->digest_size;
    });

Exit:
    return ret;
}